

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_credits.hpp
# Opt level: O0

void __thiscall
PatchCredits::inject_all_checks_signature(PatchCredits *this,ROM *rom,RandomizerWorld *world)

{
  ItemSourceOnGround *item_source_00;
  initializer_list<unsigned_short> __l;
  bool bVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint32_t uVar4;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *this_00;
  reference ppIVar5;
  array<unsigned_short,_69UL> *this_01;
  const_reference pvVar6;
  Item *this_02;
  reference pvVar7;
  reference puVar8;
  bool local_16a;
  allocator<char> local_141;
  string local_140;
  uint16_t local_11a;
  iterator iStack_118;
  uint16_t word;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1_1;
  ByteArray all_checks_bytes;
  uint16_t mask;
  uint8_t bit_index;
  size_t word_index;
  Flag flag;
  bool more_than_max_inventory;
  uint8_t max_qty;
  uint16_t quantity_in_world;
  uint8_t item_id;
  ItemSource *item_source;
  iterator __end1;
  iterator __begin1;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range1;
  allocator<unsigned_short> local_89;
  unsigned_short local_88 [32];
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> all_checks_signature;
  RandomizerWorld *world_local;
  ROM *rom_local;
  PatchCredits *this_local;
  
  local_88[0x18] = 0xffff;
  local_88[0x19] = 0xffff;
  local_88[0x1a] = 0xffff;
  local_88[0x1b] = 0xff87;
  local_88[0x1c] = 0xf7ff;
  local_88[0x1d] = 0xff3f;
  local_88[0x10] = 0xffff;
  local_88[0x11] = 0x7fb3;
  local_88[0x12] = 0x5efe;
  local_88[0x13] = 0xf71f;
  local_88[0x14] = 0xfcff;
  local_88[0x15] = 0xffff;
  local_88[0x16] = 0xffff;
  local_88[0x17] = 0xffff;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  local_88[0] = 0xfeff;
  local_88[1] = 0xff3f;
  local_88[2] = 0xfeff;
  local_88[3] = 0xffff;
  local_88[4] = 0xffff;
  local_88[5] = 0x300;
  local_88[6] = 0;
  local_88[7] = 0;
  local_48 = local_88;
  local_40 = 0x1e;
  all_checks_signature.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)world;
  std::allocator<unsigned_short>::allocator(&local_89);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,__l,&local_89);
  std::allocator<unsigned_short>::~allocator(&local_89);
  this_00 = RandomizerWorld::item_sources
                      ((RandomizerWorld *)
                       all_checks_signature.
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  __end1 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::begin(this_00);
  item_source = (ItemSource *)std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::end(this_00)
  ;
  while (bVar1 = __gnu_cxx::
                 operator==<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                           (&__end1,(__normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                     *)&item_source), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppIVar5 = __gnu_cxx::
              __normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
              ::operator*(&__end1);
    item_source_00 = (ItemSourceOnGround *)*ppIVar5;
    bVar1 = ItemSource::is_ground_item((ItemSource *)item_source_00);
    if ((((bVar1) || (bVar1 = ItemSource::is_shop_item((ItemSource *)item_source_00), bVar1)) &&
        (uVar2 = ItemSource::item_id((ItemSource *)item_source_00), uVar2 != '>')) &&
       (uVar2 = ItemSource::item_id((ItemSource *)item_source_00), uVar2 != '\x7f')) {
      flag._15_1_ = ItemSource::item_id((ItemSource *)item_source_00);
      this_01 = RandomizerWorld::item_quantities
                          ((RandomizerWorld *)
                           all_checks_signature.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar6 = std::array<unsigned_short,_69UL>::operator[](this_01,(ulong)(byte)flag._15_1_);
      flag._12_2_ = *pvVar6;
      this_02 = ItemSource::item((ItemSource *)item_source_00);
      flag._11_1_ = Item::max_quantity(this_02);
      flag.bit = '\0';
      if (flag._12_2_ == 0) {
        local_16a = flag._15_1_ == '/' || flag._15_1_ == '\x1b';
        flag.bit = local_16a;
      }
      else if (((byte)flag._11_1_ < 9) && ((ushort)(byte)flag._11_1_ < (ushort)flag._12_2_)) {
        flag.bit = '\x01';
      }
      if ((flag._15_1_ == '?') || (flag.bit != '\0')) {
        PatchFlagsForGroundItems::get_checked_flag_for_item_source
                  ((PatchFlagsForGroundItems *)&word_index,item_source_00);
        all_checks_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = flag._vptr_Flag._2_1_;
        if ((uint)(ushort)flag._vptr_Flag % 2 == 0) {
          all_checks_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = flag._vptr_Flag._2_1_ + 8;
        }
        uVar3 = (ushort)(1 << (all_checks_bytes.
                               super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 0x1f)) ^
                0xffff;
        all_checks_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_2_ = uVar3;
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38,
                            (ulong)((ushort)flag._vptr_Flag - 0x1060 >> 1));
        *pvVar7 = *pvVar7 & uVar3;
      }
    }
    __gnu_cxx::
    __normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>::
    operator++(&__end1);
  }
  ByteArray::ByteArray((ByteArray *)&__range1_1);
  __end1_1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  iStack_118 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  while (bVar1 = __gnu_cxx::
                 operator==<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                           (&__end1_1,&stack0xfffffffffffffee8), ((bVar1 ^ 0xffU) & 1) != 0) {
    puVar8 = __gnu_cxx::
             __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&__end1_1);
    local_11a = *puVar8;
    ByteArray::add_word((ByteArray *)&__range1_1,local_11a);
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&__end1_1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_141);
  uVar4 = md::ROM::inject_bytes
                    (rom,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1_1,
                     &local_140);
  this->_all_checks_bytes_addr = uVar4;
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  ByteArray::~ByteArray((ByteArray *)&__range1_1);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_38);
  return;
}

Assistant:

void inject_all_checks_signature(md::ROM& rom, RandomizerWorld& world)
    {
        std::vector<uint16_t> all_checks_signature = {
            0xFEFF, 0xFF3F, 0xFEFF, 0xFFFF, 0xFFFF, 0x0300, 0x0000, 0x0000,
            0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
            0xFFFF, 0x7FB3, 0x5EFE, 0xF71F, 0xFCFF, 0xFFFF, 0xFFFF, 0xFFFF,
            0xFFFF, 0xFFFF, 0xFFFF, 0xFF87, 0xF7FF, 0xFF3F
        };

        // If item has less than 9 max quantity in inventory (because items with 9 max are inherently consumable),
        // and the world contains more than the max carriable amount, there is a "golden ending softlock" potential.
        // For instance, taking a first Garlic in a chest makes all Garlic in shops disappear forever, since it can
        // never be consumed. It's also true with basically any unique item in the game that could be put in big
        // amounts in items distribution and would lead to unachievable golden endings.

        // For this reason, we just remove the need for checks that *might* become unobtainable for those reasons.
        // (Oh and also, empty items on ground cannot be taken. That's just sad.)
        for(ItemSource* item_source : world.item_sources())
        {
            if(!item_source->is_ground_item() && !item_source->is_shop_item())
                continue;
            if(item_source->item_id() == ITEM_LIFESTOCK || item_source->item_id() == ITEM_ARCHIPELAGO) // Lifestock can (almost) always be taken
                continue;

            uint8_t item_id = item_source->item_id();
            uint16_t quantity_in_world = world.item_quantities()[item_id];
            uint8_t max_qty = item_source->item()->max_quantity();
            bool more_than_max_inventory = false;
            if(quantity_in_world == 0)
            {
                // If quantity is 0 but we still encounter that item, it means we are in Archipelago / plando context.
                // In that case, distribution is fixed and we only have to care about two cases: Garlic and Logs.
                more_than_max_inventory = (item_id == ITEM_LOGS || item_id == ITEM_GARLIC);
            }
            else if(max_qty < 9 && quantity_in_world > max_qty)
            {
                more_than_max_inventory = true;
            }

            if(item_id == ITEM_NONE || more_than_max_inventory)
            {
                Flag flag = PatchFlagsForGroundItems::get_checked_flag_for_item_source(reinterpret_cast<ItemSourceOnGround*>(item_source));
                size_t word_index = (flag.byte - (PatchFlagsForGroundItems::GROUND_ITEM_FLAGS_START_ADDR & 0xFFFF)) / 2;

                uint8_t bit_index = flag.bit;
                if(flag.byte % 2 == 0)
                    bit_index += 8;
                uint16_t mask = ~(1 << bit_index);

                all_checks_signature[word_index] &= mask;
            }
        }

        ByteArray all_checks_bytes;
        for(uint16_t word : all_checks_signature)
            all_checks_bytes.add_word(word);
        _all_checks_bytes_addr = rom.inject_bytes(all_checks_bytes);
    }